

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void emit_atom(JSParseState *s,JSAtom name)

{
  undefined4 in_ESI;
  undefined8 in_RDI;
  JSAtom v;
  JSContext *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff0;
  
  v = (JSAtom)((ulong)in_RDI >> 0x20);
  JS_DupAtom(unaff_retaddr,v);
  emit_u32((JSParseState *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),v);
  return;
}

Assistant:

static void emit_atom(JSParseState *s, JSAtom name)
{
    emit_u32(s, JS_DupAtom(s->ctx, name));
}